

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O1

void GetScriptingCommands(cmState *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCommand *pcVar2;
  cmFindPackageCommand *this;
  cmGetPropertyCommand *this_00;
  cmSetPropertyCommand *this_01;
  cmVariableWatchCommand *this_02;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"break","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f218;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cmake_minimum_required","");
  pcVar2 = (cmCommand *)operator_new(0x48);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCMakeMinimumRequired_0067f3a8;
  pcVar2[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  pcVar2[1].Error._M_dataplus._M_p = (pointer)0x0;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cmake_policy","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f408;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"configure_file","");
  pcVar2 = (cmCommand *)operator_new(0x80);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmConfigureFileCommand_0067f468;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)(pcVar2 + 1));
  pcVar2[1].Makefile = (cmMakefile *)&pcVar2[1].Error._M_string_length;
  pcVar2[1].Error._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_string_length = 0;
  *(cmMakefile ***)((long)&pcVar2[1].Error.field_2 + 8) = &pcVar2[2].Makefile;
  pcVar2[2]._vptr_cmCommand = (_func_int **)0x0;
  *(undefined1 *)&pcVar2[2].Makefile = 0;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"continue","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f4c8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"exec_program","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f708;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"execute_process","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f768;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"file","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f928;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_file","");
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindFileCommand::cmFindFileCommand((cmFindFileCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_library","");
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_package","");
  this = (cmFindPackageCommand *)operator_new(0x358);
  cmFindPackageCommand::cmFindPackageCommand(this);
  cmState::AddBuiltinCommand(state,&local_40,(cmCommand *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_path","");
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_program","");
  pcVar2 = (cmCommand *)operator_new(0x228);
  cmFindProgramCommand::cmFindProgramCommand((cmFindProgramCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"foreach","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067ff18;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"function","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680018;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get_cmake_property","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_006800d8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get_directory_property","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680138;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get_filename_component","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680198;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get_property","");
  this_00 = (cmGetPropertyCommand *)operator_new(0x98);
  cmGetPropertyCommand::cmGetPropertyCommand(this_00);
  cmState::AddBuiltinCommand(state,&local_40,(cmCommand *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"if","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_006803c0;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"include","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680420;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"include_guard","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680540;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"list","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680840;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"macro","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680a08;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"make_directory","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680ac8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mark_as_advanced","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680b28;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"math","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680b88;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"message","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680be8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"option","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680c48;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cmake_parse_arguments","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680d08;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"return","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680f48;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"separate_arguments","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680fa8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681008;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set_property","");
  this_01 = (cmSetPropertyCommand *)operator_new(0xa8);
  cmSetPropertyCommand::cmSetPropertyCommand(this_01);
  cmState::AddBuiltinCommand(state,&local_40,(cmCommand *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"site_name","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681248;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681308;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unset","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_006818d8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"while","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681ae8;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"else","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ELSE command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"elseif","");
  cmState::AddUnexpectedCommand
            (state,&local_40,"An ELSEIF command was found outside of a proper IF ENDIF structure.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"endforeach","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"endfunction","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ENDFUNCTION command was found outside of a proper FUNCTION ENDFUNCTION structure. Or its arguments did not match the opening FUNCTION command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"endif","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"endmacro","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"endwhile","");
  cmState::AddUnexpectedCommand
            (state,&local_40,
             "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cmake_host_system_information","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f348;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"remove","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00680e88;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"variable_watch","");
  this_02 = (cmVariableWatchCommand *)operator_new(0x60);
  cmVariableWatchCommand::cmVariableWatchCommand(this_02);
  cmState::AddBuiltinCommand(state,&local_40,(cmCommand *)this_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"write_file","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681b60;
  cmState::AddBuiltinCommand(state,&local_40,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"build_name","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_0067f2e8;
  cmState::AddDisallowedCommand
            (state,&local_40,pcVar2,CMP0036,
             "The build_name command should not be called; see CMP0036.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"use_mangled_mesa","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00681938;
  cmState::AddDisallowedCommand
            (state,&local_40,pcVar2,CMP0030,
             "The use_mangled_mesa command should not be called; see CMP0030.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetScriptingCommands(cmState* state)
{
  state->AddBuiltinCommand("break", new cmBreakCommand);
  state->AddBuiltinCommand("cmake_minimum_required",
                           new cmCMakeMinimumRequired);
  state->AddBuiltinCommand("cmake_policy", new cmCMakePolicyCommand);
  state->AddBuiltinCommand("configure_file", new cmConfigureFileCommand);
  state->AddBuiltinCommand("continue", new cmContinueCommand);
  state->AddBuiltinCommand("exec_program", new cmExecProgramCommand);
  state->AddBuiltinCommand("execute_process", new cmExecuteProcessCommand);
  state->AddBuiltinCommand("file", new cmFileCommand);
  state->AddBuiltinCommand("find_file", new cmFindFileCommand);
  state->AddBuiltinCommand("find_library", new cmFindLibraryCommand);
  state->AddBuiltinCommand("find_package", new cmFindPackageCommand);
  state->AddBuiltinCommand("find_path", new cmFindPathCommand);
  state->AddBuiltinCommand("find_program", new cmFindProgramCommand);
  state->AddBuiltinCommand("foreach", new cmForEachCommand);
  state->AddBuiltinCommand("function", new cmFunctionCommand);
  state->AddBuiltinCommand("get_cmake_property",
                           new cmGetCMakePropertyCommand);
  state->AddBuiltinCommand("get_directory_property",
                           new cmGetDirectoryPropertyCommand);
  state->AddBuiltinCommand("get_filename_component",
                           new cmGetFilenameComponentCommand);
  state->AddBuiltinCommand("get_property", new cmGetPropertyCommand);
  state->AddBuiltinCommand("if", new cmIfCommand);
  state->AddBuiltinCommand("include", new cmIncludeCommand);
  state->AddBuiltinCommand("include_guard", new cmIncludeGuardCommand);
  state->AddBuiltinCommand("list", new cmListCommand);
  state->AddBuiltinCommand("macro", new cmMacroCommand);
  state->AddBuiltinCommand("make_directory", new cmMakeDirectoryCommand);
  state->AddBuiltinCommand("mark_as_advanced", new cmMarkAsAdvancedCommand);
  state->AddBuiltinCommand("math", new cmMathCommand);
  state->AddBuiltinCommand("message", new cmMessageCommand);
  state->AddBuiltinCommand("option", new cmOptionCommand);
  state->AddBuiltinCommand("cmake_parse_arguments",
                           new cmParseArgumentsCommand);
  state->AddBuiltinCommand("return", new cmReturnCommand);
  state->AddBuiltinCommand("separate_arguments",
                           new cmSeparateArgumentsCommand);
  state->AddBuiltinCommand("set", new cmSetCommand);
  state->AddBuiltinCommand("set_property", new cmSetPropertyCommand);
  state->AddBuiltinCommand("site_name", new cmSiteNameCommand);
  state->AddBuiltinCommand("string", new cmStringCommand);
  state->AddBuiltinCommand("unset", new cmUnsetCommand);
  state->AddBuiltinCommand("while", new cmWhileCommand);

  state->AddUnexpectedCommand(
    "else", "An ELSE command was found outside of a proper "
            "IF ENDIF structure. Or its arguments did not match "
            "the opening IF command.");
  state->AddUnexpectedCommand(
    "elseif", "An ELSEIF command was found outside of a proper "
              "IF ENDIF structure.");
  state->AddUnexpectedCommand(
    "endforeach", "An ENDFOREACH command was found outside of a proper "
                  "FOREACH ENDFOREACH structure. Or its arguments did "
                  "not match the opening FOREACH command.");
  state->AddUnexpectedCommand(
    "endfunction", "An ENDFUNCTION command was found outside of a proper "
                   "FUNCTION ENDFUNCTION structure. Or its arguments did not "
                   "match the opening FUNCTION command.");
  state->AddUnexpectedCommand(
    "endif", "An ENDIF command was found outside of a proper "
             "IF ENDIF structure. Or its arguments did not match "
             "the opening IF command.");
  state->AddUnexpectedCommand(
    "endmacro", "An ENDMACRO command was found outside of a proper "
                "MACRO ENDMACRO structure. Or its arguments did not "
                "match the opening MACRO command.");
  state->AddUnexpectedCommand(
    "endwhile", "An ENDWHILE command was found outside of a proper "
                "WHILE ENDWHILE structure. Or its arguments did not "
                "match the opening WHILE command.");

#if defined(CMAKE_BUILD_WITH_CMAKE)
  state->AddBuiltinCommand("cmake_host_system_information",
                           new cmCMakeHostSystemInformationCommand);
  state->AddBuiltinCommand("remove", new cmRemoveCommand);
  state->AddBuiltinCommand("variable_watch", new cmVariableWatchCommand);
  state->AddBuiltinCommand("write_file", new cmWriteFileCommand);

  state->AddDisallowedCommand(
    "build_name", new cmBuildNameCommand, cmPolicies::CMP0036,
    "The build_name command should not be called; see CMP0036.");
  state->AddDisallowedCommand(
    "use_mangled_mesa", new cmUseMangledMesaCommand, cmPolicies::CMP0030,
    "The use_mangled_mesa command should not be called; see CMP0030.");

#endif
}